

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bv.c
# Opt level: O0

void bv_init(bv_t *bv,uchar *data,uint len)

{
  uint len_local;
  uchar *data_local;
  bv_t *bv_local;
  
  if (bv == (bv_t *)0x0) {
    __assert_fail("bv != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/bv.c",
                  0x32,"void bv_init(bv_t *, unsigned char *, unsigned int)");
  }
  if (data != (uchar *)0x0) {
    bv->data = data;
    bv->len = len;
    bv->idx = 0;
    return;
  }
  __assert_fail("data != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/bv.c",
                0x33,"void bv_init(bv_t *, unsigned char *, unsigned int)");
}

Assistant:

void bv_init(bv_t *bv, unsigned char *data, unsigned int len) {
  assert(bv != NULL);
  assert(data != NULL);
  
  bv->data = data;
  bv->len  = len;
  bv->idx  = 0;
}